

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void postprocess_cpu_params(cpu_params *cpuparams,cpu_params *role_model)

{
  uint uVar1;
  common_log *log;
  void *in_RSI;
  uint *in_RDI;
  int32_t i;
  int32_t n_set;
  int local_18;
  uint local_14;
  
  local_14 = 0;
  if ((int)*in_RDI < 0) {
    if (in_RSI == (void *)0x0) {
      uVar1 = cpu_get_num_math();
      *in_RDI = uVar1;
    }
    else {
      memcpy(in_RDI,in_RSI,0x214);
    }
  }
  for (local_18 = 0; local_18 < 0x200; local_18 = local_18 + 1) {
    if ((*(byte *)((long)in_RDI + (long)local_18 + 4) & 1) != 0) {
      local_14 = local_14 + 1;
    }
  }
  if (((local_14 != 0) && ((int)local_14 < (int)*in_RDI)) && (-1 < common_log_verbosity_thold)) {
    log = common_log_main();
    common_log_add(log,GGML_LOG_LEVEL_WARN,
                   "Not enough set bits in CPU mask (%d) to satisfy requested thread count: %d\n",
                   (ulong)local_14,(ulong)*in_RDI);
  }
  return;
}

Assistant:

void postprocess_cpu_params(cpu_params& cpuparams, const cpu_params* role_model) {
    int32_t n_set = 0;

    if (cpuparams.n_threads < 0) {
        // Assuming everything about cpuparams is invalid
        if (role_model != nullptr) {
            cpuparams = *role_model;
        } else {
            cpuparams.n_threads = cpu_get_num_math();
        }
    }

    for (int32_t i = 0; i < GGML_MAX_N_THREADS; i++) {
        if (cpuparams.cpumask[i]) {
            n_set++;
        }
    }

    if (n_set && n_set < cpuparams.n_threads) {
        // Not enough set bits, may experience performance issues.
        LOG_WRN("Not enough set bits in CPU mask (%d) to satisfy requested thread count: %d\n", n_set, cpuparams.n_threads);
    }
}